

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall SQCompiler::ClassExp(SQCompiler *this)

{
  SQFuncState *pSVar1;
  undefined2 uVar2;
  SQInstruction in_RAX;
  SQInteger SVar3;
  SQInteger SVar4;
  SQInteger SVar5;
  SQInstruction local_28;
  
  SVar5 = -1;
  SVar4 = -1;
  local_28 = in_RAX;
  if (this->_token == 0x134) {
    SVar4 = SQLexer::Lex(&this->_lex);
    this->_token = SVar4;
    Expression(this);
    SVar4 = SQFuncState::TopTarget(this->_fs);
  }
  if (this->_token == 0x140) {
    SVar5 = SQLexer::Lex(&this->_lex);
    this->_token = SVar5;
    pSVar1 = this->_fs;
    SVar5 = SQFuncState::PushTarget(pSVar1,-1);
    local_28._arg0 = (uchar)SVar5;
    local_28._0_5_ = 0x2100000000;
    local_28 = (SQInstruction)((ulong)local_28._4_2_ << 0x20);
    SQFuncState::AddInstruction(pSVar1,&local_28);
    ParseTableOrClass(this,0x2c,0x141);
    SVar5 = SQFuncState::TopTarget(this->_fs);
  }
  Expect(this,0x7b);
  if (SVar5 != -1) {
    SQFuncState::PopTarget(this->_fs);
  }
  if (SVar4 != -1) {
    SQFuncState::PopTarget(this->_fs);
  }
  pSVar1 = this->_fs;
  SVar3 = SQFuncState::PushTarget(pSVar1,-1);
  local_28._arg0 = (uchar)SVar3;
  local_28._0_5_ = 0x2100000000;
  uVar2 = local_28._4_2_;
  local_28.op = (char)uVar2;
  local_28._arg0 = (char)((ushort)uVar2 >> 8);
  local_28._arg1 = (int)SVar4;
  local_28._arg2 = (uchar)SVar5;
  local_28._arg3 = '\x02';
  SQFuncState::AddInstruction(pSVar1,&local_28);
  ParseTableOrClass(this,0x3b,0x7d);
  return;
}

Assistant:

void ClassExp()
    {
        SQInteger base = -1;
        SQInteger attrs = -1;
        if(_token == TK_EXTENDS) {
            Lex(); Expression();
            base = _fs->TopTarget();
        }
        if(_token == TK_ATTR_OPEN) {
            Lex();
            _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(),0,NOT_TABLE);
            ParseTableOrClass(_SC(','),TK_ATTR_CLOSE);
            attrs = _fs->TopTarget();
        }
        Expect(_SC('{'));
        if(attrs != -1) _fs->PopTarget();
        if(base != -1) _fs->PopTarget();
        _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(), base, attrs,NOT_CLASS);
        ParseTableOrClass(_SC(';'),_SC('}'));
    }